

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::CleanupToReparseHelper(FunctionBody *this)

{
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar1;
  SourceContextInfo *pSVar2;
  SourceDynamicProfileManager *this_00;
  SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *pSVar3;
  SmallSpanSequence *obj;
  AuxStatementData *candidate;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  FunctionEntryPointInfo *pFVar7;
  undefined4 *puVar8;
  Type *pTVar9;
  FunctionBody *pFVar10;
  long lVar11;
  undefined1 local_38 [8];
  EditingIterator iter;
  
  CleanupRecyclerData(this,false,true);
  pSVar1 = (this->entryPoints).ptr;
  lVar11 = (long)(pSVar1->
                 super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ).
                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                 .count;
  if (lVar11 != 0) {
    memset((pSVar1->
           super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ).
           super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
           .buffer.ptr,0,lVar11 << 3);
    (pSVar1->
    super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ).
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
    .count = 0;
  }
  CreateNewDefaultEntryPoint(this);
  FunctionProxy::SetOriginalEntryPoint
            ((FunctionProxy *)this,
             ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->CurrentThunk
            );
  if ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_defaultEntryPointInfo.ptr !=
      (ProxyEntryPointInfo *)0x0) {
    pFVar7 = GetDefaultFunctionEntryPointInfo(this);
    pFVar7->entryPointIndex = 0;
  }
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)15,Js::ByteBlock*>
            ((FunctionProxy *)this,(ByteBlock *)0x0);
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)16,Js::ByteBlock*>
            ((FunctionProxy *)this,(ByteBlock *)0x0);
  if (((this->byteCodeBlock).ptr != (ByteBlock *)0x0) &&
     (((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 8) != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1425,"(!this->byteCodeBlock || !this->IsWasmFunction())",
                                "We should never reset the bytecode block for Wasm");
    if (!bVar5) goto LAB_006d14db;
    *puVar8 = 0;
  }
  (this->byteCodeBlock).ptr = (ByteBlock *)0x0;
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)10,Js::LoopHeader*>
            ((FunctionProxy *)this,(LoopHeader *)0x0);
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<void>_>::WriteBarrierSet
            (&this->m_constTable,(WriteBarrierPtr<void> *)0x0);
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)11,Js::FunctionCodeGenRuntimeData**>
            ((FunctionProxy *)this,(FunctionCodeGenRuntimeData **)0x0);
  (this->cacheIdToPropertyIdMap).ptr = (int *)0x0;
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)21,Js::PropertyIdArray*>
            ((FunctionProxy *)this,(PropertyIdArray *)0x0);
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)17,int*>
            ((FunctionProxy *)this,(int *)0x0);
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)27,unsigned_short*>
            ((FunctionProxy *)this,(unsigned_short *)0x0);
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)18,UnifiedRegex::RegexPattern**>
            ((FunctionProxy *)this,(RegexPattern **)0x0);
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)23,Js::AuxArray<unsigned_int>*>
            ((FunctionProxy *)this,(AuxArray<unsigned_int> *)0x0);
  FunctionProxy::
  SetAuxPtr<(Js::FunctionProxy::AuxPointerType)4,JsUtil::List<Js::FunctionBody::StatementMap*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>*>
            ((FunctionProxy *)this,
             (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)0x0);
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)8,Js::FunctionCodeGenRuntimeData**>
            ((FunctionProxy *)this,(FunctionCodeGenRuntimeData **)0x0);
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)9,Js::PropertyIdOnRegSlotsContainer*>
            ((FunctionProxy *)this,(PropertyIdOnRegSlotsContainer *)0x0);
  this->profiledLdLenCount = 0;
  this->profiledLdElemCount = 0;
  this->profiledStElemCount = 0;
  this->profiledCallSiteCount = 0;
  this->profiledArrayCallSiteCount = 0;
  this->profiledDivOrRemCount = 0;
  this->profiledSwitchCount = 0;
  this->profiledReturnTypeCount = 0;
  this->profiledSlotCount = 0;
  SetLoopCount(this,0);
  this->m_envDepth = 0xffff;
  SetByteCodeCount(this,0);
  SetByteCodeWithoutLDACount(this,0);
  SetByteCodeInLoopCount(this,0);
  if ((this->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) {
    pSVar2 = (((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
               m_srcInfo).ptr)->sourceContextInfo).ptr;
    if ((pSVar2 != (SourceContextInfo *)0x0) &&
       (this_00 = (pSVar2->sourceDynamicProfileManager).ptr,
       this_00 != (SourceDynamicProfileManager *)0x0)) {
      SourceDynamicProfileManager::RemoveDynamicProfileInfo
                (this_00,((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)
                         ->functionId);
    }
    pSVar3 = (((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
               super_ScriptContextBase).javascriptLibrary)->cache).profileInfoList.ptr;
    if (pSVar3 != (SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
      iter.super_Iterator.current = (NodeBase *)0x0;
      local_38 = (undefined1  [8])pSVar3;
      iter.super_Iterator.list = pSVar3;
      do {
        do {
          bVar5 = SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::EditingIterator
                  ::Next((EditingIterator *)local_38);
          if (!bVar5) goto LAB_006d12fd;
          pTVar9 = SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::Iterator::Data
                             ((Iterator *)local_38);
        } while (pTVar9->ptr->hasFunctionBody != true);
        pFVar10 = DynamicProfileInfo::GetFunctionBody(pTVar9->ptr);
      } while (pFVar10 != this);
      SListBase<Js::DynamicProfileInfo_*,_Memory::Recycler,_RealCount>::EditingIterator::
      UnlinkCurrentNode((EditingIterator *)local_38);
    }
LAB_006d12fd:
    (this->dynamicProfileInfo).ptr = (DynamicProfileInfo *)0x0;
  }
  this->field_0x179 = this->field_0x179 & 0xfe;
  this->field_0x17d = this->field_0x17d & 0xfe;
  SetVarCount(this,0);
  SetConstantCount(this,0);
  this->field_0x17c = this->field_0x17c & 1;
  SetInnerScopeCount(this,0);
  this->hasCachedScopePropIds = false;
  ResetObjectLiteralTypes(this);
  SetInlineCacheCount(this,0);
  SetRootObjectLoadInlineCacheStart(this,0);
  SetRootObjectLoadMethodInlineCacheStart(this,0);
  SetRootObjectStoreInlineCacheStart(this,0);
  SetIsInstInlineCacheCount(this,0);
  this->field_0x17a = this->field_0x17a & 0xf7;
  SetReferencedPropertyIdCount(this,0);
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)14,Js::PolymorphicCallSiteInfo*>
            ((FunctionProxy *)this,(PolymorphicCallSiteInfo *)0x0);
  (this->executionState).interpretedCount = 0;
  this->debuggerScopeIndex = 0;
  this->m_asmJsTotalLoopCount = 0;
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0x77fdffff;
  this->loopInterpreterLimit = DAT_0143ef08;
  ReinitializeExecutionModeAndLimits(this);
  if ((this->m_sourceInfo).m_probeCount != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x148b,"(this->m_sourceInfo.m_probeCount == 0)",
                                "this->m_sourceInfo.m_probeCount == 0");
    if (!bVar5) goto LAB_006d14db;
    *puVar8 = 0;
  }
  (this->m_sourceInfo).m_probeBackingBlock.ptr = (ByteBlock *)0x0;
  this->m_DEBUG_executionCount = 0;
  obj = (this->m_sourceInfo).pSpanSequence;
  if (obj != (SmallSpanSequence *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::SmallSpanSequence>
              (&Memory::HeapAllocator::Instance,obj);
    (this->m_sourceInfo).pSpanSequence = (Type)0x0;
  }
  candidate = (this->m_sourceInfo).m_auxStatementData.ptr;
  if (candidate != (AuxStatementData *)0x0) {
    BVar6 = Memory::Recycler::IsValidObject
                      (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                       recycler,candidate,0);
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0x149c,
                                  "(m_scriptContext->GetRecycler()->IsValidObject(m_sourceInfo.m_auxStatementData))"
                                  ,
                                  "m_scriptContext->GetRecycler()->IsValidObject(m_sourceInfo.m_auxStatementData)"
                                 );
      if (!bVar5) {
LAB_006d14db:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
    }
    (this->m_sourceInfo).m_auxStatementData.ptr = (AuxStatementData *)0x0;
  }
  return;
}

Assistant:

void FunctionBody::CleanupToReparseHelper()
    {
        this->CleanupRecyclerData(/* isShutdown */ false, true /* capture entry point cleanup stack trace */);

        this->entryPoints->ClearAndZero();

        // Store the originalEntryPoint to restore it back immediately.
        this->CreateNewDefaultEntryPoint();
        this->SetOriginalEntryPoint(this->GetScriptContext()->CurrentThunk);
        if (this->m_defaultEntryPointInfo)
        {
            this->GetDefaultFunctionEntryPointInfo()->entryPointIndex = 0;
        }

        this->SetAuxiliaryData(nullptr);
        this->SetAuxiliaryContextData(nullptr);
        AssertMsg(!this->byteCodeBlock || !this->IsWasmFunction(), "We should never reset the bytecode block for Wasm");
        this->byteCodeBlock = nullptr;
        this->SetLoopHeaderArray(nullptr);
        this->SetConstTable(nullptr);
        this->SetCodeGenRuntimeData(nullptr);
        this->cacheIdToPropertyIdMap = nullptr;
        this->SetFormalsPropIdArray(nullptr);
        this->SetReferencedPropertyIdMap(nullptr);
#if ENABLE_NATIVE_CODEGEN
        this->SetCallSiteToCallApplyCallSiteArray(nullptr);
#endif
        this->SetLiteralRegexs(nullptr);
        this->SetSlotIdInCachedScopeToNestedIndexArray(nullptr);
        this->SetStatementMaps(nullptr);
        this->SetCodeGenGetSetRuntimeData(nullptr);
        this->SetPropertyIdOnRegSlotsContainer(nullptr);
        this->profiledLdLenCount = 0;
        this->profiledLdElemCount = 0;
        this->profiledStElemCount = 0;
        this->profiledCallSiteCount = 0;
        this->profiledArrayCallSiteCount = 0;
        this->profiledDivOrRemCount = 0;
        this->profiledSwitchCount = 0;
        this->profiledReturnTypeCount = 0;
        this->profiledSlotCount = 0;
        this->SetLoopCount(0);

        this->m_envDepth = (uint16)-1;

        this->SetByteCodeCount(0);
        this->SetByteCodeWithoutLDACount(0);
        this->SetByteCodeInLoopCount(0);

#if ENABLE_PROFILE_INFO
        if (this->dynamicProfileInfo != nullptr)
        {
            SourceContextInfo * sourceContextInfo = GetSourceContextInfo();
            if(sourceContextInfo && sourceContextInfo->sourceDynamicProfileManager)
            {
                sourceContextInfo->sourceDynamicProfileManager->RemoveDynamicProfileInfo(GetFunctionInfo()->GetLocalFunctionId());
            }

#ifdef DYNAMIC_PROFILE_STORAGE
            DynamicProfileInfoList * profileInfoList = GetScriptContext()->GetProfileInfoList();
            if (profileInfoList)
            {
                FOREACH_SLISTBASE_ENTRY_EDITING(Field(DynamicProfileInfo*), info, profileInfoList, iter)
                {
                    if (info->HasFunctionBody() && info->GetFunctionBody() == this)
                    {
                        iter.UnlinkCurrent();
                        break;
                    }
                }
                NEXT_SLISTBASE_ENTRY_EDITING;
            }
#endif
        this->dynamicProfileInfo = nullptr;
        }
#endif
        this->hasExecutionDynamicProfileInfo = false;

        this->SetFirstTmpRegister(Constants::NoRegister);
        this->SetVarCount(0);
        this->SetConstantCount(0);
        this->SetLocalClosureRegister(Constants::NoRegister);
        this->SetParamClosureRegister(Constants::NoRegister);
        this->SetLocalFrameDisplayRegister(Constants::NoRegister);
        this->SetEnvRegister(Constants::NoRegister);
        this->SetThisRegisterForEventHandler(Constants::NoRegister);
        this->SetFirstInnerScopeRegister(Constants::NoRegister);
        this->SetFuncExprScopeRegister(Constants::NoRegister);
        this->SetInnerScopeCount(0);
        this->hasCachedScopePropIds = false;

        this->ResetObjectLiteralTypes();

        this->SetInlineCacheCount(0);
        this->SetRootObjectLoadInlineCacheStart(0);
        this->SetRootObjectLoadMethodInlineCacheStart(0);
        this->SetRootObjectStoreInlineCacheStart(0);
        this->SetIsInstInlineCacheCount(0);
        this->m_inlineCachesOnFunctionObject = false;
        this->SetReferencedPropertyIdCount(0);
#if ENABLE_PROFILE_INFO
        this->SetPolymorphicCallSiteInfoHead(nullptr);
#endif

        this->executionState.SetInterpretedCount(0);

        this->m_hasDoneAllNonLocalReferenced = false;

        this->SetDebuggerScopeIndex(0);

        this->m_isAsmJsScheduledForFullJIT = false;
        this->m_asmJsTotalLoopCount = 0;

        recentlyBailedOutOfJittedLoopBody = false;

        SetLoopInterpreterLimit(CONFIG_FLAG(LoopInterpretCount));
        ReinitializeExecutionModeAndLimits();

        Assert(this->m_sourceInfo.m_probeCount == 0);
        this->m_sourceInfo.m_probeBackingBlock = nullptr;

#if DBG
        // This could be non-zero if the function threw exception before. Reset it.
        this->m_DEBUG_executionCount = 0;
#endif
        if (this->m_sourceInfo.pSpanSequence != nullptr)
        {
            HeapDelete(this->m_sourceInfo.pSpanSequence);
            this->m_sourceInfo.pSpanSequence = nullptr;
        }

        if (this->m_sourceInfo.m_auxStatementData != nullptr)
        {
            // This must be consistent with how we allocate the data for this and inner structures.
            // We are using recycler, thus it's enough just to set to NULL.
            Assert(m_scriptContext->GetRecycler()->IsValidObject(m_sourceInfo.m_auxStatementData));
            m_sourceInfo.m_auxStatementData = nullptr;
        }
    }